

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall google::protobuf::UnknownFieldSet::ClearFallback(UnknownFieldSet *this)

{
  ulong uVar1;
  int iVar2;
  Arena *pAVar3;
  pointer this_00;
  bool is_soo;
  UnknownFieldSet UStack_28;
  
  iVar2 = internal::SooRep::size
                    ((SooRep *)this,
                     (undefined1  [16])
                     ((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4) ==
                     (undefined1  [16])0x0);
  if (iVar2 != 0) {
    pAVar3 = arena(this);
    if (pAVar3 == (Arena *)0x0) {
      iVar2 = internal::SooRep::size
                        ((SooRep *)this,
                         (undefined1  [16])
                         ((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4
                         ) == (undefined1  [16])0x0);
      iVar2 = iVar2 + 1;
      do {
        this_00 = RepeatedField<google::protobuf::UnknownField>::Mutable(&this->fields_,iVar2 + -2);
        UnknownField::Delete(this_00);
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
    }
    uVar1 = (this->fields_).soo_rep_.field_0.long_rep.elements_int;
    if ((uVar1 & 4) != 0) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    is_soo = (uVar1 & 4) == 0;
    internal::SooRep::size((SooRep *)this,is_soo);
    iVar2 = internal::SooRep::size((SooRep *)this,is_soo);
    if ((iVar2 != 0) &&
       ((undefined1  [16])
        ((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    RepeatedField<google::protobuf::UnknownField>::set_size(&this->fields_,(uVar1 & 4) == 0,0);
    return;
  }
  ClearFallback(&UStack_28);
}

Assistant:

void UnknownFieldSet::ClearFallback() {
  ABSL_DCHECK(!fields_.empty());
  if (arena() == nullptr) {
    int n = fields_.size();
    do {
      (fields_)[--n].Delete();
    } while (n > 0);
  }
  fields_.Clear();
}